

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O2

void LoadWalls(walltype *walls,int numwalls,sectortype *bsec)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  FTextureID FVar12;
  FTextureID FVar13;
  size_t __n;
  long lVar14;
  line_t *plVar15;
  size_t sVar16;
  side_t *psVar17;
  vertex_t *pvVar18;
  side_t *psVar19;
  ulong uVar20;
  side_t *psVar21;
  ushort uVar22;
  DWORD DVar23;
  ulong uVar24;
  long lVar25;
  int linenum;
  SWORD *pSVar26;
  ulong uVar27;
  BYTE *pBVar28;
  bool bVar29;
  double dVar30;
  long lVar31;
  long lVar32;
  double dVar33;
  char tnam [9];
  
  numlines = 0;
  uVar27 = (ulong)numwalls;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar27;
  __n = SUB168(auVar9 * ZEXT816(0xd8),0);
  sVar16 = __n;
  if (SUB168(auVar9 * ZEXT816(0xd8),8) != 0) {
    sVar16 = 0xffffffffffffffff;
  }
  numvertexes = numwalls;
  numsides = numwalls;
  sides = (side_t *)operator_new__(sVar16);
  memset(sides,0,__n);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar27;
  uVar20 = SUB168(auVar10 * ZEXT816(0x38),0);
  if (SUB168(auVar10 * ZEXT816(0x38),8) != 0) {
    uVar20 = 0xffffffffffffffff;
  }
  vertexes = (vertex_t *)operator_new__(uVar20);
  if (numwalls != 0) {
    pvVar18 = vertexes;
    do {
      (pvVar18->p).X = 0.0;
      (pvVar18->p).Y = 0.0;
      pvVar18->viewangle = 0;
      pvVar18->angletime = 0;
      pvVar18->dirty = true;
      pvVar18->numheights = 0;
      pvVar18->numsectors = 0;
      pvVar18->sectors = (sector_t **)0x0;
      pvVar18->heightlist = (float *)0x0;
      pvVar18 = pvVar18 + 1;
    } while (pvVar18 != vertexes + uVar27);
  }
  numvertexes = 0;
  uVar27 = (ulong)(uint)numsectors;
  if (numsectors < 1) {
    uVar27 = 0;
  }
  for (uVar20 = 0; uVar20 != uVar27; uVar20 = uVar20 + 1) {
    if (-1 < (long)bsec[uVar20].wallptr) {
      uVar22 = bsec[uVar20].wallnum;
      if ((short)uVar22 < 1) {
        uVar22 = 0;
      }
      uVar24 = (ulong)uVar22;
      lVar25 = (long)bsec[uVar20].wallptr * 0xd8;
      while (bVar29 = uVar24 != 0, uVar24 = uVar24 - 1, bVar29) {
        *(sector_t **)((long)sides->textures + lVar25 + -0x10) = sectors + uVar20;
        lVar25 = lVar25 + 0xd8;
      }
    }
  }
  psVar21 = (side_t *)(ulong)(uint)numwalls;
  if (numwalls < 1) {
    psVar21 = (side_t *)0x0;
  }
  pBVar28 = &walls->xpanning;
  lVar25 = 0xb4;
  for (psVar19 = (side_t *)0x0; psVar21 != psVar19; psVar19 = (side_t *)((long)&psVar19->sector + 1)
      ) {
    mysnprintf(tnam,9,"BTIL%04d");
    FVar12 = FTextureManager::GetTexture(&TexMan,tnam,5,0);
    mysnprintf(tnam,9,"BTIL%04d");
    FVar13 = FTextureManager::GetTexture(&TexMan,tnam,5,0);
    psVar17 = sides;
    dVar30 = (double)(*(uint *)pBVar28 & 0xff);
    dVar33 = (double)(*(uint *)pBVar28 >> 8 & 0xff);
    pdVar1 = (double *)((long)sides->textures + lVar25 + -0x54);
    *pdVar1 = dVar30;
    pdVar1[1] = dVar33;
    pdVar1 = (double *)((long)psVar17 + lVar25 + -0x74);
    *pdVar1 = dVar30;
    pdVar1[1] = dVar33;
    pdVar1 = (double *)((long)psVar17 + lVar25 + -0xa4);
    *pdVar1 = dVar30;
    pdVar1[1] = dVar33;
    *(int *)((long)psVar17 + lVar25 + -0x84) = FVar12.texnum;
    *(int *)((long)psVar17->textures + lVar25 + -0x34) = FVar12.texnum;
    if ((*(short *)(pBVar28 + -0xc) < 0) || ((*(ushort *)(pBVar28 + -10) & 0x20) != 0)) {
      *(int *)((long)psVar17->textures + lVar25 + -100) = FVar12.texnum;
    }
    else if ((*(ushort *)(pBVar28 + -10) & 0x10) == 0) {
      *(undefined4 *)((long)psVar17->textures + lVar25 + -100) = 0;
    }
    else {
      *(int *)((long)psVar17->textures + lVar25 + -100) = FVar13.texnum;
    }
    *(ushort *)((long)psVar17->textures + lVar25 + -0x14) = (ushort)pBVar28[-2] << 3;
    uVar27 = -(ulong)((double)pBVar28[-1] * 0.125 == 0.0);
    uVar27 = ~uVar27 & (ulong)((double)pBVar28[-1] * 0.125) | uVar27 & 0x3ff0000000000000;
    *(ulong *)((long)psVar17->textures + lVar25 + -0x3c) = uVar27;
    *(ulong *)((long)psVar17->textures + lVar25 + -0x6c) = uVar27;
    *(ulong *)((long)psVar17 + lVar25 + -0x8c) = uVar27;
    *(undefined8 *)((long)psVar17->textures + lVar25 + -0x44) = 0x3ff0000000000000;
    *(undefined8 *)((long)psVar17->textures + lVar25 + -0x74) = 0x3ff0000000000000;
    *(undefined8 *)((long)psVar17 + lVar25 + -0x94) = 0x3ff0000000000000;
    *(short *)((long)psVar17->textures + lVar25 + -0x12) =
         0xff - ((short)(char)pBVar28[-4] + (short)(char)pBVar28[-4]);
    *(undefined1 *)((long)psVar17->textures + lVar25 + -0x10) = 1;
    sVar6 = *(short *)(pBVar28 + -0x10);
    *(int *)((long)psVar17->textures + lVar25 + -0x18) = (int)sVar6;
    psVar17[sVar6].LeftSide = (DWORD)psVar19;
    lVar14 = (long)*(short *)(pBVar28 + -0xe);
    if ((long)psVar19 < lVar14 || lVar14 < 0) {
      plVar15 = (line_t *)(long)numlines;
      numlines = numlines + 1;
    }
    else {
      plVar15 = psVar17[lVar14].linedef;
    }
    *(line_t **)((long)psVar17->textures + lVar25 + -0x24) = plVar15;
    lVar25 = lVar25 + 0xd8;
    pBVar28 = pBVar28 + 0x20;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (long)numlines;
  sVar16 = SUB168(auVar11 * ZEXT816(0x98),0);
  uVar27 = 0xffffffffffffffff;
  if (SUB168(auVar11 * ZEXT816(0x98),8) == 0) {
    uVar27 = sVar16;
  }
  lines = (line_t *)operator_new__(uVar27);
  lVar25 = 0;
  memset(lines,0,sVar16);
  pSVar26 = &walls->cstat;
  for (psVar19 = (side_t *)0x0; psVar21 != psVar19; psVar19 = (side_t *)((long)&psVar19->sector + 1)
      ) {
    psVar17 = (side_t *)(long)pSVar26[-2];
    if ((long)psVar17 < 0 || (long)psVar19 < (long)psVar17) {
      iVar7 = *(int *)((long)&sides->linedef + lVar25);
      lines[iVar7].sidedef[0] = psVar19;
      lines[iVar7].sidedef[1] = psVar17;
      pvVar18 = FindVertex(((walltype *)(pSVar26 + -7))->x,*(SDWORD *)(pSVar26 + -5));
      lines[iVar7].v1 = pvVar18;
      pvVar18 = FindVertex(walls[pSVar26[-3]].x,walls[pSVar26[-3]].y);
      lines[iVar7].v2 = pvVar18;
      lines[iVar7].frontsector = *(sector_t **)((long)sides->textures + lVar25 + -0x10);
      plVar15 = lines;
      lines[iVar7].flags = lines[iVar7].flags | 0x100000;
      if ((long)pSVar26[-1] < 0) {
        plVar15[iVar7].backsector = (sector_t *)0x0;
        plVar15 = lines;
      }
      else {
        plVar15[iVar7].backsector = sectors + pSVar26[-1];
        plVar15 = lines;
        lines[iVar7].flags = lines[iVar7].flags | 4;
      }
      P_AdjustLine(plVar15 + iVar7);
      uVar22 = *pSVar26;
      if ((char)uVar22 < '\0') {
        lines[iVar7].alpha = *(double *)(&DAT_00671c00 + (ulong)((uVar22 >> 9 & 1) == 0) * 8);
      }
      if ((uVar22 & 1) != 0) {
        lines[iVar7].flags = lines[iVar7].flags | 1;
      }
      if (pSVar26[-2] < 0) {
        if ((uVar22 & 4) != 0) {
          lines[iVar7].flags = lines[iVar7].flags | 0x10;
        }
      }
      else {
        uVar8 = lines[iVar7].flags;
        if ((uVar22 & 4) == 0) {
          DVar23 = uVar8 | 0x10;
        }
        else {
          DVar23 = uVar8 | 8;
        }
        lines[iVar7].flags = DVar23;
      }
      if ((uVar22 & 0x40) != 0) {
        lines[iVar7].flags = lines[iVar7].flags | 0x8000;
      }
    }
    lVar25 = lVar25 + 0xd8;
    pSVar26 = pSVar26 + 0x10;
  }
  lVar14 = 0xd8;
  for (lVar25 = 0; lVar25 < numsectors; lVar25 = lVar25 + 1) {
    sVar6 = bsec->wallptr;
    tnam._0_8_ = walls + sVar6;
    unique0x00004a80 = walls + walls[sVar6].point2;
    uVar2 = walls[walls[sVar6].point2].x;
    uVar4 = walls[walls[sVar6].point2].y;
    uVar3 = walls[sVar6].x;
    uVar5 = walls[sVar6].y;
    lVar31 = CONCAT44(-(uint)((int)(uVar2 - uVar3) < 0),uVar2 - uVar3);
    lVar32 = CONCAT44(-(uint)((int)(uVar4 - uVar5) < 0),uVar4 - uVar5);
    dVar30 = c_sqrt((double)(lVar32 * lVar32 + lVar31 * lVar31));
    if (((long)dVar30 & 0x7ffffffffffffffU) != 0) {
      if (((bsec->floorstat & 2) != 0) && (bsec->floorheinum != 0)) {
        CalcPlane((SlopeWork *)tnam,(secplane_t *)((long)sectors->planes + lVar14 + -0x28));
      }
      if (((bsec->ceilingstat & 2) != 0) && (bsec->ceilingheinum != 0)) {
        CalcPlane((SlopeWork *)tnam,(secplane_t *)((long)&sectors->planes[0].xform.xOffs + lVar14));
      }
      linenum = (int)sides[bsec->wallptr].linedef;
      iVar7 = *(int *)(lines[linenum].sidedef + 1);
      if ((bsec->floorstat & 0x40) != 0) {
        P_AlignFlat(linenum,(uint)(iVar7 == bsec->wallptr),0);
      }
      if ((bsec->ceilingstat & 0x40) != 0) {
        P_AlignFlat(linenum,(uint)(iVar7 == bsec->wallptr),0);
      }
    }
    bsec = bsec + 1;
    lVar14 = lVar14 + 0x268;
  }
  psVar19 = (side_t *)0x0;
  psVar21 = (side_t *)(ulong)(uint)numlines;
  if (numlines < 1) {
    psVar21 = psVar19;
  }
  for (lVar25 = 0; (long)psVar21 * 0x98 - lVar25 != 0; lVar25 = lVar25 + 0x98) {
    lVar14 = *(long *)((long)lines->sidedef + lVar25);
    lVar31 = *(long *)((long)lines->sidedef + lVar25 + 8);
    psVar17 = sides + lVar14;
    if (lVar14 < 0) {
      psVar17 = psVar19;
    }
    *(side_t **)((long)lines->sidedef + lVar25) = psVar17;
    psVar17 = sides + lVar31;
    if (lVar31 < 0) {
      psVar17 = psVar19;
    }
    *(side_t **)((long)lines->sidedef + lVar25 + 8) = psVar17;
  }
  uVar20 = 0;
  uVar27 = (ulong)(uint)numsides;
  if (numsides < 1) {
    uVar27 = uVar20;
  }
  while( true ) {
    if (uVar27 * 0xd8 - uVar20 == 0) {
      return;
    }
    if (*(long *)((long)sides->textures + (uVar20 - 0x10)) == 0) break;
    *(line_t **)((long)&sides->linedef + uVar20) = lines + *(long *)((long)&sides->linedef + uVar20)
    ;
    uVar20 = uVar20 + 0xd8;
  }
  __assert_fail("sides[i].sector != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_buildmap.cpp"
                ,0x2a5,"void LoadWalls(walltype *, int, sectortype *)");
}

Assistant:

static void LoadWalls (walltype *walls, int numwalls, sectortype *bsec)
{
	int i, j;

	// Setting numvertexes to the same as numwalls is overly conservative,
	// but the extra vertices will be removed during the BSP building pass.
	numsides = numvertexes = numwalls;
	numlines = 0;

	sides = new side_t[numsides];
	memset (sides, 0, numsides*sizeof(side_t));

	vertexes = new vertex_t[numvertexes];
	numvertexes = 0;

	// First mark each sidedef with the sector it belongs to
	for (i = 0; i < numsectors; ++i)
	{
		if (bsec[i].wallptr >= 0)
		{
			for (j = 0; j < bsec[i].wallnum; ++j)
			{
				sides[j + bsec[i].wallptr].sector = sectors + i;
			}
		}
	}

	// Now copy wall properties to their matching sidedefs
	for (i = 0; i < numwalls; ++i)
	{
		char tnam[9];
		FTextureID overpic, pic;

		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].picnum));
		pic = TexMan.GetTexture (tnam, FTexture::TEX_Build);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].overpicnum));
		overpic = TexMan.GetTexture (tnam, FTexture::TEX_Build);

		walls[i].x = LittleLong(walls[i].x);
		walls[i].y = LittleLong(walls[i].y);
		walls[i].point2 = LittleShort(walls[i].point2);
		walls[i].cstat = LittleShort(walls[i].cstat);
		walls[i].nextwall = LittleShort(walls[i].nextwall);
		walls[i].nextsector = LittleShort(walls[i].nextsector);

		sides[i].SetTextureXOffset((double)walls[i].xpanning);
		sides[i].SetTextureYOffset((double)walls[i].ypanning);

		sides[i].SetTexture(side_t::top, pic);
		sides[i].SetTexture(side_t::bottom, pic);
		if (walls[i].nextsector < 0 || (walls[i].cstat & 32))
		{
			sides[i].SetTexture(side_t::mid, pic);
		}
		else if (walls[i].cstat & 16)
		{
			sides[i].SetTexture(side_t::mid, overpic);
		}
		else
		{
			sides[i].SetTexture(side_t::mid, FNullTextureID());
		}

		sides[i].TexelLength = walls[i].xrepeat * 8;
		sides[i].SetTextureYScale(walls[i].yrepeat / 8.);
		sides[i].SetTextureXScale(1.);
		sides[i].SetLight(SHADE2LIGHT(walls[i].shade));
		sides[i].Flags = WALLF_ABSLIGHTING;
		sides[i].RightSide = walls[i].point2;
		sides[walls[i].point2].LeftSide = i;

		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			sides[i].linedef = sides[walls[i].nextwall].linedef;
		}
		else
		{
			sides[i].linedef = (line_t*)(intptr_t)(numlines++);
		}
	}

	// Set line properties that Doom doesn't store per-sidedef
	lines = new line_t[numlines];
	memset (lines, 0, numlines*sizeof(line_t));

	for (i = 0, j = -1; i < numwalls; ++i)
	{
		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			continue;
		}

		j = int(intptr_t(sides[i].linedef));
		lines[j].sidedef[0] = (side_t*)(intptr_t)i;
		lines[j].sidedef[1] = (side_t*)(intptr_t)walls[i].nextwall;
		lines[j].v1 = FindVertex (walls[i].x, walls[i].y);
		lines[j].v2 = FindVertex (walls[walls[i].point2].x, walls[walls[i].point2].y);
		lines[j].frontsector = sides[i].sector;
		lines[j].flags |= ML_WRAP_MIDTEX;
		if (walls[i].nextsector >= 0)
		{
			lines[j].backsector = sectors + walls[i].nextsector;
			lines[j].flags |= ML_TWOSIDED;
		}
		else
		{
			lines[j].backsector = NULL;
		}
		P_AdjustLine (&lines[j]);
		if (walls[i].cstat & 128)
		{
			if (walls[i].cstat & 512)
			{
				lines[j].alpha = 1/3.;
			}
			else
			{
				lines[j].alpha = 2/3.;
			}
		}
		if (walls[i].cstat & 1)
		{
			lines[j].flags |= ML_BLOCKING;
		}
		if (walls[i].nextwall < 0)
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		else
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGTOP;
			}
			else
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		if (walls[i].cstat & 64)
		{
			lines[j].flags |= ML_BLOCKEVERYTHING;
		}
	}

	// Finish setting sector properties that depend on walls
	for (i = 0; i < numsectors; ++i, ++bsec)
	{
		SlopeWork slope;

		slope.wal = &walls[bsec->wallptr];
		slope.wal2 = &walls[slope.wal->point2];
		slope.dx = slope.wal2->x - slope.wal->x;
		slope.dy = slope.wal2->y - slope.wal->y;
		slope.i = long (g_sqrt ((double)(slope.dx*slope.dx+slope.dy*slope.dy))) << 5;
		if (slope.i == 0)
		{
			continue;
		}
		if ((bsec->floorstat & 2) && (bsec->floorheinum != 0))
		{ // floor is sloped
			slope.heinum = -LittleShort(bsec->floorheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->floorZ;
			CalcPlane (slope, sectors[i].floorplane);
		}
		if ((bsec->ceilingstat & 2) && (bsec->ceilingheinum != 0))
		{ // ceiling is sloped
			slope.heinum = -LittleShort(bsec->ceilingheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->ceilingZ;
			CalcPlane (slope, sectors[i].ceilingplane);
		}
		int linenum = int(intptr_t(sides[bsec->wallptr].linedef));
		int sidenum = int(intptr_t(lines[linenum].sidedef[1]));
		if (bsec->floorstat & 64)
		{ // floor is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
		if (bsec->ceilingstat & 64)
		{ // ceiling is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
	}
	for (i = 0; i < numlines; i++)
	{
		intptr_t front = intptr_t(lines[i].sidedef[0]);
		intptr_t back = intptr_t(lines[i].sidedef[1]);
		lines[i].sidedef[0] = front >= 0 ? &sides[front] : NULL;
		lines[i].sidedef[1] = back >= 0 ? &sides[back] : NULL;
	}
	for (i = 0; i < numsides; i++)
	{
		assert(sides[i].sector != NULL);
		sides[i].linedef = &lines[intptr_t(sides[i].linedef)];
	}
}